

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_substring.c
# Opt level: O2

int pcre2_substring_nametable_scan_16
              (pcre2_code_16 *code,PCRE2_SPTR16 stringname,PCRE2_SPTR16 *firstptr,
              PCRE2_SPTR16 *lastptr)

{
  uint uVar1;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  uint8_t *puVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  uint8_t *puVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  PCRE2_SPTR16 str2;
  uint uVar16;
  uint uVar17;
  uint local_a0;
  
  uVar2 = code->name_entry_size;
  uVar10 = (ulong)((uint)uVar2 + (uint)uVar2);
  uVar17 = 0;
  uVar15 = (uint)code->name_count;
  do {
    if ((ushort)uVar15 <= (ushort)uVar17) {
      return -0x31;
    }
    uVar16 = (uVar17 & 0xffff) + uVar15 >> 1;
    uVar13 = (ulong)(((uint)uVar2 + (uint)uVar2) * uVar16);
    iVar7 = _pcre2_strcmp_16(stringname,(PCRE2_SPTR16)(code[1].start_bitmap + (uVar13 - 0x26)));
    if (iVar7 == 0) {
      lVar11 = uVar13 + 0x88;
      uVar3 = code->name_count;
      str2 = (PCRE2_SPTR16)((long)code + uVar13 + (0x8a - uVar10));
      lVar4 = 0;
      lVar6 = -uVar13;
      do {
        lVar14 = lVar6;
        lVar9 = lVar4;
        if (lVar11 < 0x89) break;
        lVar11 = lVar11 - uVar10;
        iVar8 = _pcre2_strcmp_16(stringname,str2);
        str2 = (PCRE2_SPTR16)((long)str2 - uVar10);
        lVar4 = lVar9 - uVar10;
        lVar6 = lVar14 + uVar10;
      } while (iVar8 == 0);
      puVar5 = code[1].start_bitmap + (uVar13 - 0x28);
      do {
        lVar11 = lVar9;
        puVar12 = puVar5;
        if (code[1].start_bitmap + ((ulong)uVar3 - 1) * (ulong)uVar2 * 2 + -0x28 <= puVar12) break;
        iVar8 = _pcre2_strcmp_16(stringname,(PCRE2_SPTR16)(puVar12 + uVar10 + 2));
        puVar5 = puVar12 + uVar10;
        lVar9 = lVar11 - uVar10;
      } while (iVar8 == 0);
      if (firstptr == (PCRE2_SPTR16 *)0x0) {
        if (lVar11 == 0) {
          local_a0 = (uint)*(ushort *)(code[1].start_bitmap + (uVar13 - 0x28));
          uVar16 = uVar15;
        }
        else {
          local_a0 = 0xffffffce;
          uVar16 = uVar15;
        }
      }
      else {
        *firstptr = (PCRE2_SPTR16)((long)code + (0x88 - lVar14));
        *lastptr = (PCRE2_SPTR16)puVar12;
        local_a0 = (uint)uVar2;
        uVar16 = uVar15;
      }
    }
    else {
      uVar1 = uVar16 + 1;
      if (0 < iVar7) {
        uVar16 = uVar15;
        uVar17 = uVar1;
      }
    }
    uVar15 = uVar16;
    if (iVar7 == 0) {
      return local_a0;
    }
  } while( true );
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_substring_nametable_scan(const pcre2_code *code, PCRE2_SPTR stringname,
  PCRE2_SPTR *firstptr, PCRE2_SPTR *lastptr)
{
uint16_t bot = 0;
uint16_t top = code->name_count;
uint16_t entrysize = code->name_entry_size;
PCRE2_SPTR nametable = (PCRE2_SPTR)((char *)code + sizeof(pcre2_real_code));

while (top > bot)
  {
  uint16_t mid = (top + bot) / 2;
  PCRE2_SPTR entry = nametable + entrysize*mid;
  int c = PRIV(strcmp)(stringname, entry + IMM2_SIZE);
  if (c == 0)
    {
    PCRE2_SPTR first;
    PCRE2_SPTR last;
    PCRE2_SPTR lastentry;
    lastentry = nametable + entrysize * (code->name_count - 1);
    first = last = entry;
    while (first > nametable)
      {
      if (PRIV(strcmp)(stringname, (first - entrysize + IMM2_SIZE)) != 0) break;
      first -= entrysize;
      }
    while (last < lastentry)
      {
      if (PRIV(strcmp)(stringname, (last + entrysize + IMM2_SIZE)) != 0) break;
      last += entrysize;
      }
    if (firstptr == NULL) return (first == last)?
      (int)GET2(entry, 0) : PCRE2_ERROR_NOUNIQUESUBSTRING;
    *firstptr = first;
    *lastptr = last;
    return entrysize;
    }
  if (c > 0) bot = mid + 1; else top = mid;
  }

return PCRE2_ERROR_NOSUBSTRING;
}